

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_drop_modules(sqlite3 *db,char **azNames)

{
  void *pvVar1;
  char *__s2;
  int iVar2;
  char *__s1;
  HashElem *pHVar3;
  char **ppcVar4;
  
  pHVar3 = (db->aModule).first;
  if (pHVar3 != (HashElem *)0x0) {
    do {
      pvVar1 = pHVar3->data;
      pHVar3 = pHVar3->next;
      if ((azNames != (char **)0x0) && (__s1 = *azNames, __s1 != (char *)0x0)) {
        __s2 = *(char **)((long)pvVar1 + 8);
        ppcVar4 = azNames + 1;
        do {
          iVar2 = strcmp(__s1,__s2);
          if (iVar2 == 0) goto LAB_00129fe0;
          __s1 = *ppcVar4;
          ppcVar4 = ppcVar4 + 1;
        } while (__s1 != (char *)0x0);
      }
      createModule(db,*(char **)((long)pvVar1 + 8),(sqlite3_module *)0x0,(void *)0x0,
                   (_func_void_void_ptr *)0x0);
LAB_00129fe0:
    } while (pHVar3 != (HashElem *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_drop_modules(sqlite3 *db, const char** azNames){
  HashElem *pThis, *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  for(pThis=sqliteHashFirst(&db->aModule); pThis; pThis=pNext){
    Module *pMod = (Module*)sqliteHashData(pThis);
    pNext = sqliteHashNext(pThis);
    if( azNames ){
      int ii;
      for(ii=0; azNames[ii]!=0 && strcmp(azNames[ii],pMod->zName)!=0; ii++){}
      if( azNames[ii]!=0 ) continue;
    }
    createModule(db, pMod->zName, 0, 0, 0);
  }
  return SQLITE_OK;
}